

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O3

QString * operator+(QString *__return_storage_ptr__,ProString *one,ProString *two)

{
  int iVar1;
  int iVar2;
  char16_t *pcVar3;
  ProString *pPVar4;
  char16_t *__dest;
  
  iVar1 = two->m_length;
  pPVar4 = one;
  if ((iVar1 == 0) || (iVar2 = one->m_length, pPVar4 = two, iVar2 == 0)) {
    QString::mid((longlong)__return_storage_ptr__,(longlong)pPVar4);
  }
  else {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,(long)(iVar2 + iVar1),Uninitialized);
    __dest = (__return_storage_ptr__->d).ptr;
    if (__dest == (char16_t *)0x0) {
      __dest = (char16_t *)&QString::_empty;
    }
    pcVar3 = (one->m_string).d.ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest,pcVar3 + one->m_offset,(long)one->m_length * 2);
    pcVar3 = (two->m_string).d.ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest + one->m_length,pcVar3 + two->m_offset,(long)two->m_length * 2);
  }
  return __return_storage_ptr__;
}

Assistant:

QString operator+(const ProString &one, const ProString &two)
{
    if (two.m_length) {
        if (!one.m_length) {
            return two.toQString();
        } else {
            QString neu(one.m_length + two.m_length, Qt::Uninitialized);
            ushort *ptr = (ushort *)neu.constData();
            memcpy(ptr, one.m_string.constData() + one.m_offset, one.m_length * 2);
            memcpy(ptr + one.m_length, two.m_string.constData() + two.m_offset, two.m_length * 2);
            return neu;
        }
    }
    return one.toQString();
}